

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O3

void __thiscall RoughConductorBRDF::RoughConductorBRDF(RoughConductorBRDF *this,Json *conf)

{
  RoughConductorBRDF *pRVar1;
  long *__s2;
  Json *this_00;
  value_t vVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  ComplexIorData *pCVar9;
  vec3f vVar10;
  const_iterator result;
  string name;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  RoughConductorBRDF *local_70;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  undefined8 *local_48;
  undefined8 *local_40;
  Json *local_38;
  
  *(undefined4 *)&this->field_0x30 = 2;
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x16aa98;
  *(undefined8 *)&this->field_0x28 = 0x16aac8;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Cu","");
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0x8000000000000000;
  vVar2 = conf->m_type;
  local_90._M_dataplus._M_p = (pointer)conf;
  if (vVar2 == object) {
    local_90._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[9],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [9])0x157928);
    vVar2 = conf->m_type;
LAB_0013ae2a:
    local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b0.m_it.array_iterator._M_current = (pointer)0x0;
    local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar2 == array) goto LAB_0013ae57;
    if (vVar2 == object) {
      local_b0.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_b0.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar2 != array) {
      local_90.field_2._8_8_ = 1;
      goto LAB_0013ae2a;
    }
    local_90.field_2._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
LAB_0013ae57:
    local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b0.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_b0.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_90,&local_b0);
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"material");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_90,pvVar5);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  local_38 = conf;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"roughness");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar5,(float *)&local_90);
  __s2 = local_68;
  local_40 = (undefined8 *)&(this->super_BRDF).field_0x8;
  local_48 = (undefined8 *)&(this->super_BRDF).field_0x14;
  this->alpha = local_90._M_dataplus._M_p._0_4_;
  bVar3 = false;
  lVar7 = 0;
  local_70 = this;
  do {
    lVar8 = lVar7 + 1;
    pCVar9 = complexIorList + lVar7;
    while (((pCVar9->name)._M_string_length != local_60 ||
           ((local_60 != 0 &&
            (iVar4 = bcmp((pCVar9->name)._M_dataplus._M_p,__s2,local_60), iVar4 != 0))))) {
      lVar8 = lVar8 + 1;
      pCVar9 = pCVar9 + 1;
      if (lVar8 == 0x29) {
        if (!bVar3) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "conductor material not found";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        goto LAB_0013af96;
      }
    }
    *(float *)(local_40 + 1) = (pCVar9->eta).z;
    *local_40 = *(undefined8 *)&pCVar9->eta;
    *(float *)(local_48 + 1) = (pCVar9->k).z;
    *local_48 = *(undefined8 *)&pCVar9->k;
    bVar3 = true;
    lVar7 = lVar8;
  } while (lVar8 != 0x28);
LAB_0013af96:
  this_00 = local_38;
  local_90._M_dataplus._M_p = (pointer)local_38;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0x8000000000000000;
  vVar2 = local_38->m_type;
  if (vVar2 == object) {
    local_90._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[4],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(local_38->m_value).object,(char (*) [4])"eta");
    vVar2 = this_00->m_type;
LAB_0013b00e:
    local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b0.m_it.array_iterator._M_current = (pointer)0x0;
    local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar2 == array) goto LAB_0013b040;
    if (vVar2 == object) {
      local_b0.m_it.object_iterator._M_node =
           &(((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_b0.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar2 != array) {
      local_90.field_2._8_8_ = 1;
      goto LAB_0013b00e;
    }
    local_90.field_2._M_allocated_capacity =
         (size_type)
         (((local_38->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
LAB_0013b040:
    local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b0.m_it.array_iterator._M_current =
         (((this_00->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  pRVar1 = local_70;
  local_b0.m_object = this_00;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_90,&local_b0);
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this_00,"eta");
    vVar10 = json2vec3f(pvVar5);
    *(long *)&(pRVar1->super_BRDF).field_0x8 = vVar10._0_8_;
    *(float *)&(pRVar1->super_BRDF).field_0x10 = vVar10.z;
  }
  local_90._M_dataplus._M_p = (pointer)this_00;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0x8000000000000000;
  vVar2 = this_00->m_type;
  if (vVar2 == object) {
    local_90._M_string_length =
         (size_type)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[2],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(this_00->m_value).object,(char (*) [2])"k");
    vVar2 = this_00->m_type;
LAB_0013b0f0:
    local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b0.m_it.array_iterator._M_current = (pointer)0x0;
    local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar2 != array) {
      if (vVar2 == object) {
        local_b0.m_it.object_iterator._M_node =
             &(((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_b0.m_it.primitive_iterator.m_it = 1;
      }
      goto LAB_0013b135;
    }
  }
  else {
    if (vVar2 != array) {
      local_90.field_2._8_8_ = 1;
      goto LAB_0013b0f0;
    }
    local_90.field_2._M_allocated_capacity =
         (size_type)
         (((this_00->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_b0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_b0.m_it.array_iterator._M_current =
       (((this_00->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_0013b135:
  local_b0.m_object = this_00;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_90,&local_b0);
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this_00,"k");
    vVar10 = json2vec3f(pvVar5);
    *(long *)&(pRVar1->super_BRDF).field_0x14 = vVar10._0_8_;
    *(float *)&pRVar1->field_0x1c = vVar10.z;
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

RoughConductorBRDF(const Json& conf)
	{
		std::string name = "Cu";
		if (conf.find("material") != conf.end())
			name = conf["material"];
		alpha = conf["roughness"];
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
		if (conf.find("eta") != conf.end())
			eta = json2vec3f(conf["eta"]);
		if (conf.find("k") != conf.end())
			k = json2vec3f(conf["k"]);
	}